

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_visitor.cpp
# Opt level: O1

void duckdb::LogicalOperatorVisitor::EnumerateExpressions
               (LogicalOperator *op,
               function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*)>
               *callback)

{
  LogicalOperatorType LVar1;
  pointer pBVar2;
  pointer pLVar3;
  LogicalInsert *pLVar4;
  LogicalAggregate *pLVar5;
  LogicalAnyJoin *pLVar6;
  LogicalExpressionGet *pLVar7;
  LogicalDistinct *pLVar8;
  pointer pBVar9;
  LogicalOrder *pLVar10;
  LogicalLimit *pLVar11;
  LogicalTopN *pLVar12;
  LogicalRecursiveCTE *pLVar13;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_1;
  pointer pLVar14;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *group;
  pointer pvVar15;
  pointer pBVar16;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *target;
  LogicalComparisonJoin *join;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression;
  pointer local_40;
  pointer local_38;
  
  LVar1 = op->type;
  if (LVar1 < LOGICAL_DELIM_JOIN) {
    switch(LVar1) {
    case LOGICAL_AGGREGATE_AND_GROUP_BY:
      pLVar5 = LogicalOperator::Cast<duckdb::LogicalAggregate>(op);
      pLVar14 = (pointer)(pLVar5->groups).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      pLVar3 = (pointer)(pLVar5->groups).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (pLVar14 != pLVar3) {
        do {
          local_40 = pLVar14;
          if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
          (*callback->_M_invoker)
                    ((_Any_data *)callback,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      **)&local_40);
          pLVar14 = (pointer)&pLVar14->type_info_;
        } while (pLVar14 != pLVar3);
      }
      break;
    case LOGICAL_WINDOW:
    case LOGICAL_UNNEST:
    case LOGICAL_TOP_N|LOGICAL_PROJECTION:
    case LOGICAL_COPY_TO_FILE:
      break;
    case LOGICAL_LIMIT:
      pLVar11 = LogicalOperator::Cast<duckdb::LogicalLimit>(op);
      if ((pLVar11->limit_val).expression.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
        local_40 = (pointer)&(pLVar11->limit_val).expression;
        if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
        (*callback->_M_invoker)
                  ((_Any_data *)callback,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **
                   )&local_40);
      }
      if ((pLVar11->offset_val).expression.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0)
      break;
      local_40 = (pointer)&(pLVar11->offset_val).expression;
      goto LAB_0123da2f;
    case LOGICAL_ORDER_BY:
      pLVar10 = LogicalOperator::Cast<duckdb::LogicalOrder>(op);
      pBVar16 = (pLVar10->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar2 = (pLVar10->orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pBVar16 != pBVar2) {
        do {
          local_40 = (pointer)&pBVar16->expression;
          if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
          (*callback->_M_invoker)
                    ((_Any_data *)callback,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      **)&local_40);
          pBVar16 = pBVar16 + 1;
        } while (pBVar16 != pBVar2);
      }
      break;
    case LOGICAL_TOP_N:
      pLVar12 = LogicalOperator::Cast<duckdb::LogicalTopN>(op);
      pBVar16 = (pLVar12->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar2 = (pLVar12->orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pBVar16 != pBVar2) {
        do {
          local_40 = (pointer)&pBVar16->expression;
          if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
          (*callback->_M_invoker)
                    ((_Any_data *)callback,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      **)&local_40);
          pBVar16 = pBVar16 + 1;
        } while (pBVar16 != pBVar2);
      }
      break;
    case LOGICAL_DISTINCT:
      pLVar8 = LogicalOperator::Cast<duckdb::LogicalDistinct>(op);
      pLVar14 = (pointer)(pLVar8->distinct_targets).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      pLVar3 = (pointer)(pLVar8->distinct_targets).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (pLVar14 != pLVar3) {
        do {
          local_40 = pLVar14;
          if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
          (*callback->_M_invoker)
                    ((_Any_data *)callback,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      **)&local_40);
          pLVar14 = (pointer)&pLVar14->type_info_;
        } while (pLVar14 != pLVar3);
      }
      if ((pLVar8->order_by).
          super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
          .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl !=
          (BoundOrderModifier *)0x0) {
        pBVar9 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                 ::operator->(&pLVar8->order_by);
        pBVar16 = (pBVar9->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = (pBVar9->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar16 != pBVar2) {
          do {
            local_40 = (pointer)&pBVar16->expression;
            if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_0123db11;
            (*callback->_M_invoker)
                      ((_Any_data *)callback,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        **)&local_40);
            pBVar16 = pBVar16 + 1;
          } while (pBVar16 != pBVar2);
        }
      }
      break;
    default:
      if (LVar1 == LOGICAL_EXPRESSION_GET) {
        pLVar7 = LogicalOperator::Cast<duckdb::LogicalExpressionGet>(op);
        pvVar15 = (pLVar7->expressions).
                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                  .
                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_38 = (pLVar7->expressions).
                   super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                   .
                   super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar15 != local_38) {
          do {
            pLVar3 = (pointer)(pvVar15->
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
            for (pLVar14 = (pointer)(pvVar15->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start; pLVar14 != pLVar3;
                pLVar14 = (pointer)&pLVar14->type_info_) {
              local_40 = pLVar14;
              if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0)
              goto LAB_0123db11;
              (*callback->_M_invoker)
                        ((_Any_data *)callback,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          **)&local_40);
            }
            pvVar15 = pvVar15 + 1;
          } while (pvVar15 != local_38);
        }
      }
    }
    goto switchD_0123d769_caseD_4;
  }
  if (LVar1 < LOGICAL_ASOF_JOIN) {
    if (LVar1 - 0x33 < 2) goto LAB_0123d7c2;
    if (LVar1 != LOGICAL_ANY_JOIN) goto switchD_0123d769_caseD_4;
    pLVar6 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(op);
    local_40 = (pointer)&pLVar6->condition;
  }
  else if (LVar1 - 0x38 < 2) {
LAB_0123d7c2:
    pLVar14 = (pointer)op[2].children.
                       super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    pLVar3 = (pointer)op[2].children.
                      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pLVar14 != pLVar3) {
      do {
        local_40 = pLVar14;
        if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
        (*callback->_M_invoker)
                  ((_Any_data *)callback,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **
                   )&local_40);
        pLVar14 = (pointer)&pLVar14->type_info_;
      } while (pLVar14 != pLVar3);
    }
    pLVar14 = op[1].types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pLVar3 = (pointer)op[1].estimated_cardinality;
    if (pLVar14 != pLVar3) {
      do {
        local_40 = pLVar14;
        if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
        (*callback->_M_invoker)
                  ((_Any_data *)callback,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **
                   )&local_40);
        local_40 = (pointer)&pLVar14->type_info_;
        if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
        (*callback->_M_invoker)
                  ((_Any_data *)callback,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **
                   )&local_40);
        pLVar14 = pLVar14 + 1;
      } while (pLVar14 != pLVar3);
    }
    if (op[2].types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto switchD_0123d769_caseD_4;
    local_40 = (pointer)&op[2].types;
  }
  else {
    if (LVar1 == LOGICAL_RECURSIVE_CTE) {
      pLVar13 = LogicalOperator::Cast<duckdb::LogicalRecursiveCTE>(op);
      pLVar14 = (pointer)(pLVar13->key_targets).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      pLVar3 = (pointer)(pLVar13->key_targets).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (pLVar14 != pLVar3) {
        do {
          local_40 = pLVar14;
          if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
          (*callback->_M_invoker)
                    ((_Any_data *)callback,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      **)&local_40);
          pLVar14 = (pointer)&pLVar14->type_info_;
        } while (pLVar14 != pLVar3);
      }
      goto switchD_0123d769_caseD_4;
    }
    if (LVar1 != LOGICAL_INSERT) goto switchD_0123d769_caseD_4;
    pLVar4 = LogicalOperator::Cast<duckdb::LogicalInsert>(op);
    if ((pLVar4->on_conflict_condition).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      local_40 = (pointer)&pLVar4->on_conflict_condition;
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
      (*callback->_M_invoker)
                ((_Any_data *)callback,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
                 &local_40);
    }
    if ((pLVar4->do_update_condition).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0)
    goto switchD_0123d769_caseD_4;
    local_40 = (pointer)&pLVar4->do_update_condition;
  }
LAB_0123da2f:
  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0123db11:
    ::std::__throw_bad_function_call();
  }
  (*callback->_M_invoker)
            ((_Any_data *)callback,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
             &local_40);
switchD_0123d769_caseD_4:
  pLVar14 = (pointer)(op->expressions).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (pointer)(op->expressions).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar14 != pLVar3) {
    do {
      local_40 = pLVar14;
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0123db11;
      (*callback->_M_invoker)
                ((_Any_data *)callback,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
                 &local_40);
      pLVar14 = (pointer)&pLVar14->type_info_;
    } while (pLVar14 != pLVar3);
  }
  return;
}

Assistant:

void LogicalOperatorVisitor::EnumerateExpressions(LogicalOperator &op,
                                                  const std::function<void(unique_ptr<Expression> *child)> &callback) {

	switch (op.type) {
	case LogicalOperatorType::LOGICAL_EXPRESSION_GET: {
		auto &get = op.Cast<LogicalExpressionGet>();
		for (auto &expr_list : get.expressions) {
			for (auto &expr : expr_list) {
				callback(&expr);
			}
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_ORDER_BY: {
		auto &order = op.Cast<LogicalOrder>();
		for (auto &node : order.orders) {
			callback(&node.expression);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_TOP_N: {
		auto &order = op.Cast<LogicalTopN>();
		for (auto &node : order.orders) {
			callback(&node.expression);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_DISTINCT: {
		auto &distinct = op.Cast<LogicalDistinct>();
		for (auto &target : distinct.distinct_targets) {
			callback(&target);
		}
		if (distinct.order_by) {
			for (auto &order : distinct.order_by->orders) {
				callback(&order.expression);
			}
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE: {
		auto &rec = op.Cast<LogicalRecursiveCTE>();

		for (auto &target : rec.key_targets) {
			callback(&target);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_INSERT: {
		auto &insert = op.Cast<LogicalInsert>();
		if (insert.on_conflict_condition) {
			callback(&insert.on_conflict_condition);
		}
		if (insert.do_update_condition) {
			callback(&insert.do_update_condition);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
	case LogicalOperatorType::LOGICAL_DEPENDENT_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		auto &join = op.Cast<LogicalComparisonJoin>();
		for (auto &expr : join.duplicate_eliminated_columns) {
			callback(&expr);
		}
		for (auto &cond : join.conditions) {
			callback(&cond.left);
			callback(&cond.right);
		}
		if (join.predicate) {
			callback(&join.predicate);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_ANY_JOIN: {
		auto &join = op.Cast<LogicalAnyJoin>();
		callback(&join.condition);
		break;
	}
	case LogicalOperatorType::LOGICAL_LIMIT: {
		auto &limit = op.Cast<LogicalLimit>();
		if (limit.limit_val.GetExpression()) {
			callback(&limit.limit_val.GetExpression());
		}
		if (limit.offset_val.GetExpression()) {
			callback(&limit.offset_val.GetExpression());
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY: {
		auto &aggr = op.Cast<LogicalAggregate>();
		for (auto &group : aggr.groups) {
			callback(&group);
		}
		break;
	}
	default:
		break;
	}
	for (auto &expression : op.expressions) {
		callback(&expression);
	}
}